

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

void __thiscall
cmComputeLinkInformation::AddItem
          (cmComputeLinkInformation *this,string *item,cmGeneratorTarget *tgt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s;
  bool bVar2;
  bool bVar3;
  TargetType TVar4;
  _Alloc_hider _Var5;
  string lib;
  string linkItem;
  string exe;
  Item local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  long local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  if (tgt == (cmGeneratorTarget *)0x0) {
LAB_003396ea:
    bVar2 = cmsys::SystemTools::FileIsFullPath((item->_M_dataplus)._M_p);
    if (!bVar2) {
      AddUserItem(this,item,true);
      return;
    }
    bVar2 = cmsys::SystemTools::FileIsDirectory(item);
    if (bVar2) {
      AddDirectoryItem(this,item);
      return;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Depends,item);
    AddFullItem(this,item);
    AddLibraryRuntimeInfo(this,item);
    return;
  }
  bVar2 = cmGeneratorTarget::IsExecutableWithExports(tgt);
  if (bVar2) {
    if ((this->UseImportLibrary == false) && (this->LoaderFlag == (char *)0x0)) {
      return;
    }
    bVar3 = cmGeneratorTarget::IsLinkable(tgt);
    if (!bVar3) goto LAB_003396ea;
    __s = this->LoaderFlag;
    if (__s == (char *)0x0) goto LAB_00339666;
    local_68 = 0;
    local_60._M_local_buf[0] = '\0';
    local_70 = &local_60;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_70,0,(char *)0x0,(ulong)__s);
    cmGeneratorTarget::GetFullPath(&local_50,tgt,&this->Config,this->UseImportLibrary,true);
    std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50._M_dataplus._M_p);
    paVar1 = &local_a0.Value.field_2;
    local_a0.Value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,local_70,local_70->_M_local_buf + local_68);
    local_a0.IsPath = true;
    local_a0.Target = tgt;
    std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
    emplace_back<cmComputeLinkInformation::Item>(&this->Items,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0.Value._M_dataplus._M_p,
                      local_a0.Value.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Depends,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_70 == &local_60) {
      return;
    }
  }
  else {
    bVar3 = cmGeneratorTarget::IsLinkable(tgt);
    if (!bVar3) goto LAB_003396ea;
LAB_00339666:
    TVar4 = cmGeneratorTarget::GetType(tgt);
    if (TVar4 != INTERFACE_LIBRARY) {
      bVar3 = this->UseImportLibrary;
      if (!bVar2 && bVar3 == true) {
        TVar4 = cmGeneratorTarget::GetType(tgt);
        bVar3 = TVar4 == SHARED_LIBRARY;
      }
      cmGeneratorTarget::GetFullPath(&local_a0.Value,tgt,&this->Config,bVar3,true);
      if ((this->LinkDependsNoShared != true) ||
         (TVar4 = cmGeneratorTarget::GetType(tgt), TVar4 != SHARED_LIBRARY)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->Depends,&local_a0.Value);
      }
      AddTargetItem(this,&local_a0.Value,tgt);
      AddLibraryRuntimeInfo(this,&local_a0.Value,tgt);
      _Var5._M_p = local_a0.Value._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.Value._M_dataplus._M_p == &local_a0.Value.field_2) {
        return;
      }
      goto LAB_003397f8;
    }
    local_68 = 0;
    local_60._M_local_buf[0] = '\0';
    paVar1 = &local_a0.Value.field_2;
    local_a0.Value._M_dataplus._M_p = (pointer)paVar1;
    local_70 = &local_60;
    std::__cxx11::string::_M_construct<char*>((string *)&local_a0,&local_60,&local_60);
    local_a0.IsPath = true;
    local_a0.Target = tgt;
    std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
    emplace_back<cmComputeLinkInformation::Item>(&this->Items,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0.Value._M_dataplus._M_p,
                      local_a0.Value.field_2._M_allocated_capacity + 1);
    }
    if (local_70 == &local_60) {
      return;
    }
  }
  local_a0.Value.field_2._M_allocated_capacity =
       CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]);
  _Var5._M_p = (pointer)local_70;
LAB_003397f8:
  operator_delete(_Var5._M_p,local_a0.Value.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void cmComputeLinkInformation::AddItem(std::string const& item,
                                       cmGeneratorTarget const* tgt)
{
  // Compute the proper name to use to link this library.
  const std::string& config = this->Config;
  bool impexe = (tgt && tgt->IsExecutableWithExports());
  if(impexe && !this->UseImportLibrary && !this->LoaderFlag)
    {
    // Skip linking to executables on platforms with no import
    // libraries or loader flags.
    return;
    }

  if(tgt && tgt->IsLinkable())
    {
    // This is a CMake target.  Ask the target for its real name.
    if(impexe && this->LoaderFlag)
      {
      // This link item is an executable that may provide symbols
      // used by this target.  A special flag is needed on this
      // platform.  Add it now.
      std::string linkItem;
      linkItem = this->LoaderFlag;

      std::string exe = tgt->GetFullPath(config, this->UseImportLibrary,
                                         true);
      linkItem += exe;
      this->Items.push_back(Item(linkItem, true, tgt));
      this->Depends.push_back(exe);
      }
    else if(tgt->GetType() == cmState::INTERFACE_LIBRARY)
      {
      // Add the interface library as an item so it can be considered as part
      // of COMPATIBLE_INTERFACE_ enforcement.  The generators will ignore
      // this for the actual link line.
      this->Items.push_back(Item(std::string(), true, tgt));
      }
    else
      {
      // Decide whether to use an import library.
      bool implib =
        (this->UseImportLibrary &&
         (impexe || tgt->GetType() == cmState::SHARED_LIBRARY));

      // Pass the full path to the target file.
      std::string lib = tgt->GetFullPath(config, implib, true);
      if(!this->LinkDependsNoShared ||
         tgt->GetType() != cmState::SHARED_LIBRARY)
        {
        this->Depends.push_back(lib);
        }

      this->AddTargetItem(lib, tgt);
      this->AddLibraryRuntimeInfo(lib, tgt);
      }
    }
  else
    {
    // This is not a CMake target.  Use the name given.
    if(cmSystemTools::FileIsFullPath(item.c_str()))
      {
      if(cmSystemTools::FileIsDirectory(item))
        {
        // This is a directory.
        this->AddDirectoryItem(item);
        }
      else
        {
        // Use the full path given to the library file.
        this->Depends.push_back(item);
        this->AddFullItem(item);
        this->AddLibraryRuntimeInfo(item);
        }
      }
    else
      {
      // This is a library or option specified by the user.
      this->AddUserItem(item, true);
      }
    }
}